

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManIsNormalized(Gia_Man_t *p)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  uVar8 = p->vCis->nSize;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar8) {
    uVar3 = (ulong)uVar8;
  }
  lVar5 = 0xc;
  while (uVar3 != uVar2) {
    uVar2 = uVar2 + 1;
    if ((long)p->nObjs <= (long)uVar2) goto LAB_00779a94;
    puVar1 = (uint *)(&p->pObjs->field_0x0 + lVar5);
    lVar5 = lVar5 + 0xc;
    if ((~*puVar1 & 0x9fffffff) != 0) {
      return 0;
    }
  }
  iVar4 = p->vCos->nSize;
  lVar5 = (long)iVar4;
  if (0 < lVar5) {
    iVar4 = ((p->nObjs + uVar8) - iVar4) - uVar8;
    lVar6 = (long)iVar4;
    lVar7 = lVar6 * 0xc;
    do {
      if ((iVar4 < 0) || (p->nObjs <= lVar6)) {
LAB_00779a94:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar8 = (uint)*(undefined8 *)(&p->pObjs->field_0x0 + lVar7);
      if (-1 < (int)uVar8) {
        return 0;
      }
      if ((uVar8 & 0x1fffffff) == 0x1fffffff) {
        return 0;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0xc;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return 1;
}

Assistant:

int Gia_ManIsNormalized( Gia_Man_t * p )  
{
    int i, nOffset;
    nOffset = 1;
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        if ( !Gia_ObjIsCi( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    nOffset = 1 + Gia_ManCiNum(p) + Gia_ManAndNum(p);
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        if ( !Gia_ObjIsCo( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    return 1;
}